

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccolumn_bmod.c
# Opt level: O2

int ccolumn_bmod(int jcol,int nseg,singlecomplex *dense,singlecomplex *tempv,int *segrep,int *repfnz
                ,int fpanelc,GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  uint ncol;
  int *piVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  int iVar10;
  int_t iVar11;
  long lVar12;
  ulong uVar13;
  int *piVar14;
  long lVar15;
  singlecomplex *psVar16;
  int iVar17;
  float *pfVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  int_t *piVar26;
  long lVar27;
  int iVar28;
  int_t *piVar29;
  float fVar30;
  float fVar34;
  singlecomplex sVar31;
  singlecomplex sVar32;
  singlecomplex sVar33;
  float fVar35;
  float fVar37;
  singlecomplex sVar36;
  float fVar38;
  singlecomplex sVar39;
  float fVar40;
  singlecomplex sVar41;
  singlecomplex sVar42;
  void *local_c8;
  int local_b4;
  int_t *local_b0;
  int_t *local_a8;
  int_t *local_a0;
  singlecomplex *local_98;
  int local_8c;
  uint local_88;
  int local_84;
  int local_80;
  int local_7c;
  long local_78;
  long local_70;
  int *local_68;
  long local_60;
  flops_t *local_58;
  long local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  
  local_58 = stat->ops;
  local_68 = Glu->xsup;
  local_40 = Glu->supno;
  piVar26 = Glu->lsub;
  local_a0 = Glu->xlsub;
  local_c8 = Glu->lusup;
  local_80 = 0;
  if (0 < nseg) {
    local_80 = nseg;
  }
  piVar29 = Glu->xlusup;
  local_b4 = Glu->nzlumax;
  local_78 = (long)jcol;
  local_60 = (long)local_40[local_78];
  local_70 = (long)local_c8 + 0xc;
  local_50 = (long)local_c8 + 4;
  iVar10 = 0;
  psVar16 = (singlecomplex *)(long)nseg;
  local_b0 = piVar29;
  local_a8 = piVar26;
  local_8c = local_b4;
  local_84 = jcol;
  local_48 = repfnz;
  local_38 = segrep;
  while (iVar10 != local_80) {
    local_98 = (singlecomplex *)((long)psVar16 + -1);
    iVar7 = local_38[(long)local_98];
    local_7c = iVar10;
    if ((int)local_60 != local_40[iVar7]) {
      iVar10 = local_68[local_40[iVar7]];
      iVar28 = fpanelc;
      if (fpanelc < iVar10) {
        iVar28 = iVar10;
      }
      iVar25 = iVar28 - iVar10;
      iVar17 = piVar29[iVar28] + iVar25;
      iVar8 = local_a0[iVar10] + iVar25;
      iVar21 = local_48[iVar7];
      if (local_48[iVar7] <= fpanelc) {
        iVar21 = fpanelc;
      }
      uVar20 = iVar7 - iVar28;
      lVar12 = (long)local_a0[(long)iVar10 + 1];
      iVar10 = local_a0[(long)iVar10 + 1] - local_a0[iVar10];
      lVar27 = (long)(int)(iVar8 + uVar20);
      lVar15 = (long)(int)(iVar8 + uVar20 + 1);
      uVar22 = iVar7 - iVar21;
      piVar26 = local_a8;
      piVar29 = local_b0;
      if (uVar22 == 0) {
        fVar34 = dense[local_a8[lVar27]].i;
        fVar30 = dense[local_a8[lVar27]].r;
        pfVar18 = (float *)(local_50 + (long)(int)(iVar17 + uVar20 + 1 + iVar10 * uVar20) * 8);
        for (; lVar15 < lVar12; lVar15 = lVar15 + 1) {
          sVar39.r = dense[local_a8[lVar15]].r - (pfVar18[-1] * fVar30 + *pfVar18 * -fVar34);
          sVar39.i = dense[local_a8[lVar15]].i - (pfVar18[-1] * fVar34 + *pfVar18 * fVar30);
          dense[local_a8[lVar15]] = sVar39;
          pfVar18 = pfVar18 + 2;
        }
      }
      else {
        ncol = uVar22 + 1;
        if ((int)uVar22 < 3) {
          iVar7 = local_a8[lVar27];
          iVar17 = (iVar10 + 1) * uVar20 + iVar17;
          iVar28 = local_a8[lVar27 + -1];
          lVar19 = (long)(iVar17 - iVar10);
          fVar35 = dense[iVar28].r;
          fVar37 = dense[iVar28].i;
          fVar30 = dense[iVar7].r;
          fVar34 = dense[iVar7].i;
          if (ncol == 2) {
            fVar2 = *(float *)((long)local_c8 + lVar19 * 8);
            fVar3 = *(float *)((long)local_c8 + lVar19 * 8 + 4);
            sVar31.r = fVar30 - (fVar2 * fVar35 + fVar3 * -fVar37);
            sVar31.i = fVar34 - (fVar2 * fVar37 + fVar3 * fVar35);
            dense[iVar7] = sVar31;
            lVar27 = local_70 + (long)iVar17 * 8;
            lVar19 = local_70 + lVar19 * 8;
            for (lVar23 = 0; lVar15 + lVar23 < lVar12; lVar23 = lVar23 + 1) {
              fVar30 = *(float *)(lVar27 + -4 + lVar23 * 8);
              fVar34 = *(float *)(lVar27 + lVar23 * 8);
              fVar2 = *(float *)(lVar19 + -4 + lVar23 * 8);
              fVar3 = *(float *)(lVar19 + lVar23 * 8);
              sVar41.r = dense[local_a8[lVar15 + lVar23]].r -
                         (fVar2 * fVar35 + fVar3 * -fVar37 + fVar30 * sVar31.r + fVar34 * -sVar31.i)
              ;
              sVar41.i = dense[local_a8[lVar15 + lVar23]].i -
                         (fVar2 * fVar37 + fVar3 * fVar35 + fVar30 * sVar31.i + fVar34 * sVar31.r);
              dense[local_a8[lVar15 + lVar23]] = sVar41;
            }
          }
          else {
            lVar23 = (long)((iVar17 - iVar10) - iVar10);
            fVar38 = dense[local_a8[lVar27 + -2]].i;
            fVar40 = -fVar38;
            fVar2 = *(float *)((long)local_c8 + lVar23 * 8 + -8);
            fVar3 = *(float *)((long)local_c8 + lVar23 * 8 + -4);
            fVar4 = *(float *)((long)local_c8 + lVar23 * 8);
            fVar5 = *(float *)((long)local_c8 + lVar23 * 8 + 4);
            fVar9 = dense[local_a8[lVar27 + -2]].r;
            sVar36.r = fVar35 - (fVar2 * fVar9 + fVar3 * fVar40);
            sVar36.i = fVar37 - (fVar2 * fVar38 + fVar3 * fVar9);
            fVar35 = *(float *)((long)local_c8 + lVar19 * 8);
            fVar37 = *(float *)((long)local_c8 + lVar19 * 8 + 4);
            sVar33.r = fVar30 - (fVar4 * fVar9 + fVar5 * fVar40 +
                                fVar35 * sVar36.r + fVar37 * -sVar36.i);
            sVar33.i = fVar34 - (fVar4 * fVar38 + fVar5 * fVar9 +
                                fVar35 * sVar36.i + fVar37 * sVar36.r);
            dense[iVar7] = sVar33;
            dense[iVar28] = sVar36;
            lVar27 = local_70 + (long)iVar17 * 8;
            lVar23 = local_70 + lVar19 * 8;
            lVar19 = lVar19 * 8 + (long)iVar10 * -8 + local_70;
            for (lVar24 = 0; lVar15 + lVar24 < lVar12; lVar24 = lVar24 + 1) {
              fVar30 = *(float *)(lVar27 + -4 + lVar24 * 8);
              fVar34 = *(float *)(lVar27 + lVar24 * 8);
              fVar35 = *(float *)(lVar23 + -4 + lVar24 * 8);
              fVar37 = *(float *)(lVar23 + lVar24 * 8);
              fVar2 = *(float *)(lVar19 + -4 + lVar24 * 8);
              fVar3 = *(float *)(lVar19 + lVar24 * 8);
              sVar42.r = dense[local_a8[lVar15 + lVar24]].r -
                         (fVar2 * fVar9 + fVar3 * fVar40 +
                         fVar35 * sVar36.r + fVar37 * -sVar36.i +
                         fVar30 * sVar33.r + fVar34 * -sVar33.i);
              sVar42.i = dense[local_a8[lVar15 + lVar24]].i -
                         (fVar2 * fVar38 + fVar3 * fVar9 +
                         fVar35 * sVar36.i + fVar37 * sVar36.r +
                         fVar30 * sVar33.i + fVar34 * sVar33.r);
              dense[local_a8[lVar15 + lVar24]] = sVar42;
            }
          }
        }
        else {
          uVar20 = (~uVar20 - iVar25) + iVar10;
          piVar1 = local_a8 + (iVar8 + (iVar21 - iVar28));
          for (uVar13 = 0; uVar13 <= uVar22; uVar13 = uVar13 + 1) {
            tempv[uVar13] = dense[piVar1[uVar13]];
          }
          iVar17 = (iVar10 + 1) * (iVar21 - iVar28) + iVar17;
          local_88 = ncol;
          clsolve(iVar10,ncol,(singlecomplex *)((long)local_c8 + (long)iVar17 * 8),tempv);
          psVar16 = tempv + local_88;
          cmatvec(iVar10,uVar20,local_88,
                  (singlecomplex *)((long)local_c8 + (long)(int)(iVar17 + local_88) * 8),tempv,
                  psVar16);
          piVar14 = piVar1;
          for (uVar13 = 0; uVar13 <= uVar22; uVar13 = uVar13 + 1) {
            dense[piVar1[uVar13]] = tempv[uVar13];
            tempv[uVar13].r = 0.0;
            tempv[uVar13].i = 0.0;
            piVar14 = piVar14 + 1;
          }
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          for (uVar13 = 0; piVar26 = local_a8, piVar29 = local_b0, uVar20 != uVar13;
              uVar13 = uVar13 + 1) {
            sVar32.r = dense[*piVar14].r - psVar16[uVar13].r;
            sVar32.i = dense[*piVar14].i - psVar16[uVar13].i;
            dense[*piVar14] = sVar32;
            psVar16[uVar13].r = 0.0;
            psVar16[uVar13].i = 0.0;
            piVar14 = piVar14 + 1;
          }
        }
      }
    }
    psVar16 = local_98;
    iVar10 = local_7c + 1;
  }
  iVar10 = piVar29[local_78];
  iVar7 = local_68[local_60];
  iVar28 = local_a0[(long)iVar7 + 1];
  iVar8 = local_a0[iVar7];
  iVar21 = local_8c;
  while( true ) {
    if ((iVar28 + iVar10) - iVar8 <= iVar21) {
      psVar16 = (singlecomplex *)((long)local_c8 + (long)iVar10 * 8);
      for (lVar12 = (long)local_a0[iVar7]; lVar12 < local_a0[(long)iVar7 + 1]; lVar12 = lVar12 + 1)
      {
        iVar28 = piVar26[lVar12];
        *psVar16 = dense[iVar28];
        dense[iVar28].r = 0.0;
        dense[iVar28].i = 0.0;
        iVar10 = iVar10 + 1;
        psVar16 = psVar16 + 1;
      }
      if (fpanelc < iVar7) {
        fpanelc = iVar7;
      }
      local_b0[local_78 + 1] = iVar10;
      iVar10 = (int)local_78;
      iVar28 = iVar10 - fpanelc;
      if (iVar28 != 0 && fpanelc <= iVar10) {
        iVar8 = local_b0[fpanelc];
        iVar21 = local_a0[(long)iVar7 + 1] - local_a0[iVar7];
        uVar20 = (iVar7 - iVar10) + iVar21;
        iVar10 = local_b0[local_78];
        local_58[0x13] = (float)((iVar28 + -1) * iVar28 * 4) + local_58[0x13];
        lVar12 = (long)iVar8 + (long)(fpanelc - iVar7);
        lVar15 = (long)iVar10 + (long)(fpanelc - iVar7);
        local_58[0x14] = (float)(int)(iVar28 * uVar20 * 8) + local_58[0x14];
        local_98 = (singlecomplex *)((long)local_c8 + lVar15 * 8);
        clsolve(iVar21,iVar28,(singlecomplex *)((long)local_c8 + lVar12 * 8),local_98);
        cmatvec(iVar21,uVar20,iVar28,
                (singlecomplex *)((long)local_c8 + (long)((int)lVar12 + iVar28) * 8),local_98,tempv)
        ;
        iVar28 = iVar28 + (int)lVar15;
        if ((int)uVar20 < 1) {
          uVar20 = 0;
        }
        for (uVar13 = 0; uVar20 != uVar13; uVar13 = uVar13 + 1) {
          uVar6 = *(undefined8 *)((long)local_c8 + uVar13 * 8 + (long)iVar28 * 8);
          *(ulong *)((long)local_c8 + uVar13 * 8 + (long)iVar28 * 8) =
               CONCAT44((float)((ulong)uVar6 >> 0x20) - tempv[uVar13].i,
                        (float)uVar6 - tempv[uVar13].r);
          tempv[uVar13].r = 0.0;
          tempv[uVar13].i = 0.0;
        }
      }
      return 0;
    }
    iVar11 = cLUMemXpand(local_84,iVar10,LUSUP,&local_b4,Glu);
    if (iVar11 != 0) break;
    piVar26 = Glu->lsub;
    local_c8 = Glu->lusup;
    iVar21 = local_b4;
  }
  return iVar11;
}

Assistant:

int
ccolumn_bmod (
	     const int  jcol,	  /* in */
	     const int  nseg,	  /* in */
	     singlecomplex     *dense,	  /* in */
	     singlecomplex     *tempv,	  /* working array */
	     int        *segrep,  /* in */
	     int        *repfnz,  /* in */
	     int        fpanelc,  /* in -- first column in the current panel */
	     GlobalLU_t *Glu,     /* modified */
	     SuperLUStat_t *stat  /* output */
	     )
{

#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int         incx = 1, incy = 1;
    singlecomplex      alpha, beta;
    
    /* krep = representative of current k-th supernode
     * fsupc = first supernodal column
     * nsupc = no of columns in supernode
     * nsupr = no of rows in supernode (used as leading dimension)
     * luptr = location of supernodal LU-block in storage
     * kfnz = first nonz in the k-th supernodal segment
     * no_zeros = no of leading zeros in a supernodal U-segment
     */
    singlecomplex      ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          fsupc, nsupc, nsupr, segsze;
    int          nrow;	  /* No of rows in the matrix of matrix-vector */
    int          jcolp1, jsupno, k, ksub, krep, krep_ind, ksupno;
    int_t        lptr, kfnz, isub, irow, i;
    int_t        no_zeros, new_next, ufirst, nextlu;
    int          fst_col; /* First column within small LU update */
    int          d_fsupc; /* Distance between the first column of the current
			     panel and the first column of the current snode. */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    singlecomplex       *lusup;
    int_t        *xlusup;
    int_t        nzlumax;
    singlecomplex       *tempv1;
    singlecomplex      zero = {0.0, 0.0};
    singlecomplex      one = {1.0, 0.0};
    singlecomplex      none = {-1.0, 0.0};
    singlecomplex	 comp_temp, comp_temp1;
    int_t        mem_error;
    flops_t      *ops = stat->ops;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (singlecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;
    nzlumax = Glu->nzlumax;
    jcolp1 = jcol + 1;
    jsupno = supno[jcol];
    
    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {

	krep = segrep[k];
	k--;
	ksupno = supno[krep];
	if ( jsupno != ksupno ) { /* Outside the rectangular supernode */

	    fsupc = xsup[ksupno];
	    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

  	    /* Distance from the current supernode to the current panel; 
	       d_fsupc=0 if fsupc > fpanelc. */
  	    d_fsupc = fst_col - fsupc; 

	    luptr = xlusup[fst_col] + d_fsupc;
	    lptr = xlsub[fsupc] + d_fsupc;

	    kfnz = repfnz[krep];
	    kfnz = SUPERLU_MAX ( kfnz, fpanelc );

	    segsze = krep - kfnz + 1;
	    nsupc = krep - fst_col + 1;
	    nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	    nrow = nsupr - d_fsupc - nsupc;
	    krep_ind = lptr + nsupc - 1;




	    /* 
	     * Case 1: Update U-segment of size 1 -- col-col update 
	     */
	    if ( segsze == 1 ) {
	  	ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc;

		for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    irow = lsub[i];
		    cc_mult(&comp_temp, &ukj, &lusup[luptr]);
		    c_sub(&dense[irow], &dense[irow], &comp_temp);
		    luptr++;
		}

	    } else if ( segsze <= 3 ) {
		ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc-1;
		ukj1 = dense[lsub[krep_ind - 1]];
		luptr1 = luptr - nsupr;

		if ( segsze == 2 ) { /* Case 2: 2cols-col update */
		    cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		    c_sub(&ukj, &ukj, &comp_temp);
		    dense[lsub[krep_ind]] = ukj;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			c_add(&comp_temp, &comp_temp, &comp_temp1);
			c_sub(&dense[irow], &dense[irow], &comp_temp);
		    }
		} else { /* Case 3: 3cols-col update */
		    ukj2 = dense[lsub[krep_ind - 2]];
		    luptr2 = luptr1 - nsupr;
  		    cc_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		    c_sub(&ukj1, &ukj1, &comp_temp);

		    cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		    cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		    c_add(&comp_temp, &comp_temp, &comp_temp1);
		    c_sub(&ukj, &ukj, &comp_temp);

		    dense[lsub[krep_ind]] = ukj;
		    dense[lsub[krep_ind-1]] = ukj1;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			luptr2++;
			cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			c_add(&comp_temp, &comp_temp, &comp_temp1);
			cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			c_add(&comp_temp, &comp_temp, &comp_temp1);
			c_sub(&dense[irow], &dense[irow], &comp_temp);
		    }
		}


	    } else {
	  	/*
		 * Case: sup-col update
		 * Perform a triangular solve and block update,
		 * then scatter the result of sup-col update to dense
		 */

		no_zeros = kfnz - fst_col;

	        /* Copy U[*,j] segment from dense[*] to tempv[*] */
	        isub = lptr + no_zeros;
	        for (i = 0; i < segsze; i++) {
	  	    irow = lsub[isub];
		    tempv[i] = dense[irow];
		    ++isub; 
	        }

	        /* Dense triangular solve -- start effective triangle */
		luptr += nsupr * no_zeros + no_zeros; 
		
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#else		
		ctrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#endif		
 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
                alpha = one;
                beta = zero;
#ifdef _CRAY
		CGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		cgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		clsolve ( nsupr, segsze, &lusup[luptr], tempv );

 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
		cmatvec (nsupr, nrow , segsze, &lusup[luptr], tempv, tempv1);
#endif
		
		
                /* Scatter tempv[] into SPA dense[] as a temporary storage */
                isub = lptr + no_zeros;
                for (i = 0; i < segsze; i++) {
                    irow = lsub[isub];
                    dense[irow] = tempv[i];
                    tempv[i] = zero;
                    ++isub;
                }

		/* Scatter tempv1[] into SPA dense[] */
		for (i = 0; i < nrow; i++) {
		    irow = lsub[isub];
		    c_sub(&dense[irow], &dense[irow], &tempv1[i]);
		    tempv1[i] = zero;
		    ++isub;
		}
	    }
	    
	} /* if jsupno ... */

    } /* for each segment... */

    /*
     *	Process the supernodal portion of L\U[*,j]
     */
    nextlu = xlusup[jcol];
    fsupc = xsup[jsupno];

    /* Copy the SPA dense into L\U[*,j] */
    new_next = nextlu + xlsub[fsupc+1] - xlsub[fsupc];
    while ( new_next > nzlumax ) {
	mem_error = cLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu);
	if (mem_error) return (mem_error);
	lusup = (singlecomplex *) Glu->lusup;
	lsub = Glu->lsub;
    }

    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
        dense[irow] = zero;
	++nextlu;
    }

    xlusup[jcolp1] = nextlu;	/* Close L\U[*,jcol] */

    /* For more updates within the panel (also within the current supernode), 
     * should start from the first column of the panel, or the first column 
     * of the supernode, whichever is bigger. There are 2 cases:
     *    1) fsupc < fpanelc, then fst_col := fpanelc
     *    2) fsupc >= fpanelc, then fst_col := fsupc
     */
    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

    if ( fst_col < jcol ) {

  	/* Distance between the current supernode and the current panel.
	   d_fsupc=0 if fsupc >= fpanelc. */
  	d_fsupc = fst_col - fsupc;

	lptr = xlsub[fsupc] + d_fsupc;
	luptr = xlusup[fst_col] + d_fsupc;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	nsupc = jcol - fst_col;	/* Excluding jcol */
	nrow = nsupr - d_fsupc - nsupc;

	/* Points to the beginning of jcol in snode L\U(jsupno) */
	ufirst = xlusup[jcol] + d_fsupc;	

	ops[TRSV] += 4 * nsupc * (nsupc - 1);
	ops[GEMV] += 8 * nrow * nsupc;
	
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#else
	ctrsv_( "L", "N", "U", &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#endif
	
	alpha = none; beta = one; /* y := beta*y + alpha*A*x */

#ifdef _CRAY
	CGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	cgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	clsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );

	cmatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc],
		&lusup[ufirst], tempv );
	
        /* Copy updates from tempv[*] into lusup[*] */
	isub = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    c_sub(&lusup[isub], &lusup[isub], &tempv[i]);
	    tempv[i] = zero;
	    ++isub;
	}

#endif
	
	
    } /* if fst_col < jcol ... */ 

    return 0;
}